

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

int __thiscall booster::locale::gnu_gettext::mo_file::init(mo_file *this,EVP_PKEY_CTX *ctx)

{
  uint32_t uVar1;
  uint in_stack_0000003c;
  mo_file *in_stack_00000040;
  
  uVar1 = get(in_stack_00000040,in_stack_0000003c);
  this->size_ = (ulong)uVar1;
  uVar1 = get(in_stack_00000040,in_stack_0000003c);
  this->keys_offset_ = uVar1;
  uVar1 = get(in_stack_00000040,in_stack_0000003c);
  this->translations_offset_ = uVar1;
  uVar1 = get(in_stack_00000040,in_stack_0000003c);
  this->hash_size_ = uVar1;
  uVar1 = get(in_stack_00000040,in_stack_0000003c);
  this->hash_offset_ = uVar1;
  return (int)this;
}

Assistant:

void init()
                {
                    // Read all format sizes
                    size_=get(8);
                    keys_offset_=get(12);
                    translations_offset_=get(16);
                    hash_size_=get(20);
                    hash_offset_=get(24);
                }